

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_remote.c
# Opt level: O0

int remoteSync(mpt_output *out,int timeout)

{
  long *plVar1;
  _mpt_vptr_output *p_Var2;
  int iVar3;
  size_t sVar4;
  uint64_t uVar5;
  long local_98;
  mpt_message msg;
  size_t len;
  size_t max;
  undefined2 local_60;
  pollfd p;
  uint8_t smax;
  uint8_t idlen;
  uint8_t *data;
  uint64_t ansid;
  mpt_command *ans;
  mpt_buffer *buf;
  mpt_stream *srm;
  mpt_output *pmStack_28;
  int pos;
  mpt_out_data *od;
  mpt_output *pmStack_18;
  int timeout_local;
  mpt_output *out_local;
  
  pmStack_28 = out + -2;
  if (*(char *)((long)&out[4]._vptr + 5) == '\0') {
    out_local._4_4_ = 0;
  }
  else {
    od._4_4_ = timeout;
    pmStack_18 = out;
    if (*(int *)&out[4]._vptr < 0) {
      buf = (mpt_buffer *)out[3]._vptr;
      if ((mpt_stream *)buf == (mpt_stream *)0x0) {
        out_local._4_4_ = -1;
      }
      else {
        out_local._4_4_ =
             mpt_stream_sync((mpt_stream *)buf,(ulong)*(byte *)((long)&out[4]._vptr + 5),
                             (mpt_array *)(out + 6),timeout);
      }
    }
    else {
      do {
        if (((ulong)pmStack_28[6]._vptr & 0x2000000000) == 0) {
          max._4_4_ = *(undefined4 *)&pmStack_28[6]._vptr;
          local_60 = 1;
          srm._4_4_ = poll((pollfd *)((long)&max + 4),1,od._4_4_);
          if (srm._4_4_ < 0) {
            return -4;
          }
          if (srm._4_4_ == 0) {
            return 0;
          }
          srm._4_4_ = mpt_outdata_recv((mpt_outdata *)(pmStack_28 + 5));
          if (srm._4_4_ < 0) {
            mpt_log(0,"remoteSync",3,"%s: %s","receive failed","unable to get new data");
            return -4;
          }
          od._4_4_ = 0;
        }
        p.fd._3_1_ = *(byte *)((long)&pmStack_28[6]._vptr + 5);
        p.fd._2_1_ = *(byte *)((long)&pmStack_28[6]._vptr + 6);
        ans = (mpt_command *)pmStack_28[5]._vptr;
        register0x00000000 = (_func_int_mpt_output_ptr_int **)&ans[1].cmd;
        if ((ans == (mpt_command *)0x0) ||
           ((_func_ssize_t_mpt_output_ptr_size_t_void_ptr *)ans[1].id <
            (_func_ssize_t_mpt_output_ptr_size_t_void_ptr *)
            (long)(int)((uint)p.fd._3_1_ + (uint)p.fd._2_1_))) {
          mpt_log(0,"remoteSync",3,"%s: %s","bad message size","unable to get new data");
          return -2;
        }
        register0x00000000 =
             (_func_int_mpt_output_ptr_int **)
             ((long)register0x00000000 + (long)(int)(uint)p.fd._2_1_);
        if ((*(byte *)register0x00000000 & 0x80) == 0) {
          p_Var2 = pmStack_28[8]._vptr;
          if (p_Var2 == (_mpt_vptr_output *)0x0) {
            return 0;
          }
          msg.clen = 0;
          len = (ulong)p_Var2[1].push / 0x18;
          ansid = (uint64_t)&p_Var2[1].sync;
          while (sVar4 = len - 1, len != 0) {
            uVar5 = ansid + 0x18;
            plVar1 = (long *)(ansid + 8);
            len = sVar4;
            ansid = uVar5;
            if (*plVar1 != 0) {
              msg.clen = msg.clen + 1;
            }
          }
          return (int)msg.clen;
        }
        *(byte *)((long)&pmStack_28[6]._vptr + 4) = *(byte *)((long)&pmStack_28[6]._vptr + 4) & 0xdf
        ;
        *(byte *)register0x00000000 = *(byte *)register0x00000000 & 0x7f;
        srm._4_4_ = mpt_message_buf2id(register0x00000000,p.fd._3_1_,&data);
        if ((srm._4_4_ < 0) || (8 < srm._4_4_)) {
          mpt_log(0,"mpt::output::sync",3,"%s (%i)","bad message id",srm._4_4_);
          return -2;
        }
        ansid = mpt_command_get(pmStack_28 + 8,data);
        if (ansid == 0) {
          mpt_log(0,"mpt::output::sync",3,"%s (%lx)","bad reply id",data);
          return -2;
        }
        msg.used = (long)stack0xffffffffffffffa8 + (long)(int)(uint)p.fd._3_1_;
        local_98 = ans[1].id - (ulong)p.fd._3_1_;
        msg.base = (void *)0x0;
        msg.cont = (iovec *)0x0;
        iVar3 = (**(code **)(ansid + 8))(*(undefined8 *)(ansid + 0x10),&local_98);
      } while (-1 < iVar3);
      out_local._4_4_ = 0;
    }
  }
  return out_local._4_4_;
}

Assistant:

static int remoteSync(MPT_INTERFACE(output) *out, int timeout)
{
	static const char _func[] = "mpt::output::sync";
	
	MPT_STRUCT(out_data) *od = MPT_baseaddr(out_data, out, _out);
	int pos;
	
	if (!od->con.out._idlen) {
		return 0;
	}
	if (!MPT_socket_active(&od->con.out.sock)) {
		MPT_STRUCT(stream) *srm;
		
		if (!(srm = (void *) od->con.out.buf._buf)) {
			return MPT_ERROR(BadArgument);
		}
		return mpt_stream_sync(srm, od->con.out._idlen, &od->con._wait, timeout);
	}
	while (1) {
		MPT_STRUCT(buffer) *buf;
		MPT_STRUCT(command) *ans;
		uint64_t ansid;
		uint8_t *data, idlen, smax;
		
		/* use existing data */
		if (!(od->con.out.state & MPT_OUTFLAG(Received))) {
			struct pollfd p;
			
			p.fd = od->con.out.sock._id;
			p.events = POLLIN;
			
			if ((pos = poll(&p, 1, timeout)) < 0) {
				return MPT_ERROR(BadOperation);
			}
			if (!pos) {
				return 0;
			}
			if ((pos = mpt_outdata_recv(&od->con.out)) < 0) {
				mpt_log(0, __func__, MPT_LOG(Error), "%s: %s",
				        MPT_tr("receive failed"), MPT_tr("unable to get new data"));
				return MPT_ERROR(BadOperation);
			}
			timeout = 0;
		}
		idlen = od->con.out._idlen;
		smax = od->con.out._smax;
		buf = od->con.out.buf._buf;
		data = (void *) (buf + 1);
		
		if (!buf || buf->_used < (idlen + smax)) {
			mpt_log(0, __func__, MPT_LOG(Error), "%s: %s",
			        MPT_tr("bad message size"), MPT_tr("unable to get new data"));
			return MPT_ERROR(BadValue);
		}
		data += smax;
		/* no reply message */
		if (!(data[0] & 0x80)) {
			size_t max, len;
			
			if (!(buf = od->con._wait._buf)) {
				return 0;
			}
			ans = (void *) (buf + 1);
			max = buf->_used / sizeof(*ans);
			len = 0;
			
			/* count waiting slots */
			while (max--) {
				if ((ans++)->cmd) {
					++len;
				}
			}
			return len;
		}
		od->con.out.state &= ~MPT_OUTFLAG(Received);
		data[0] &= 0x7f;
		pos = mpt_message_buf2id(data, idlen, &ansid);
		
		if (pos < 0 || pos > (int) sizeof(uintptr_t)) {
			mpt_log(0, _func, MPT_LOG(Error), "%s (%i)",
			        MPT_tr("bad message id"), pos);
			return MPT_ERROR(BadValue);
		}
		if ((ans = mpt_command_get(&od->con._wait, ansid))) {
			MPT_STRUCT(message) msg;
			
			msg.base = data + idlen;
			msg.used = buf->_used - idlen;
			msg.cont = 0;
			msg.clen = 0;
			
			if (ans->cmd(ans->arg, &msg) < 0) {
				return 0;
			}
			continue;
		}
		mpt_log(0, _func, MPT_LOG(Error), "%s (%" PRIx64 ")",
		        MPT_tr("bad reply id"), ansid);
		return MPT_ERROR(BadValue);
	}
}